

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

void __thiscall
ON_PolylineCurve::SetArcLengthParameterization(ON_PolylineCurve *this,double tolerance)

{
  double *pdVar1;
  ON_3dPoint *this_00;
  ON_3dPoint *p;
  double dVar2;
  ON_3dVector local_48;
  int local_30;
  int local_2c;
  int i;
  int count;
  double mind;
  double d;
  double tolerance_local;
  ON_PolylineCurve *this_local;
  
  _i = tolerance;
  d = tolerance;
  tolerance_local = (double)this;
  pdVar1 = ON_SimpleArray<double>::operator[](&this->m_t,0);
  *pdVar1 = 0.0;
  local_2c = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
  for (local_30 = 1; local_30 < local_2c; local_30 = local_30 + 1) {
    this_00 = ON_SimpleArray<ON_3dPoint>::operator[]
                        ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,local_30);
    p = ON_SimpleArray<ON_3dPoint>::operator[]
                  ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,local_30 + -1);
    ON_3dPoint::operator-(&local_48,this_00,p);
    mind = ON_3dVector::Length(&local_48);
    if (mind < _i) {
      mind = _i;
    }
    dVar2 = mind;
    pdVar1 = ON_SimpleArray<double>::operator[](&this->m_t,local_30 + -1);
    if (dVar2 < ABS(*pdVar1) * 1e-05) {
      pdVar1 = ON_SimpleArray<double>::operator[](&this->m_t,local_30 + -1);
      mind = ABS(*pdVar1) * 1e-05;
    }
    pdVar1 = ON_SimpleArray<double>::operator[](&this->m_t,local_30 + -1);
    dVar2 = *pdVar1 + mind;
    pdVar1 = ON_SimpleArray<double>::operator[](&this->m_t,local_30);
    *pdVar1 = dVar2;
  }
  return;
}

Assistant:

void ON_PolylineCurve::SetArcLengthParameterization(double tolerance)
{
  double d, mind = tolerance;
  m_t[0] = 0;
  const int count = m_pline.Count();
  for (int i = 1; i < count; i++)
  {
    d = (m_pline[i] - m_pline[i - 1]).Length();
    if (d < mind)
      d = mind;
    if (d < fabs(m_t[i - 1]) * 1e-5)
      d = fabs(m_t[i - 1]) * 1e-5;
    m_t[i] = m_t[i - 1] + d;
  }
}